

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

bool __thiscall MeCab::Writer::writeUser(Writer *this,Lattice *lattice,StringBuffer *os)

{
  bool bVar1;
  long lVar2;
  long *in_RSI;
  long in_RDI;
  char *fmt;
  Node *node;
  StringBuffer *in_stack_00000138;
  Node *in_stack_00000140;
  char *in_stack_00000148;
  Lattice *in_stack_00000150;
  Writer *in_stack_00000158;
  long local_28;
  bool local_1;
  
  scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x18));
  (**(code **)(*in_RSI + 0x10))();
  bVar1 = writeNode(in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140,
                    in_stack_00000138);
  if (bVar1) {
    lVar2 = (**(code **)(*in_RSI + 0x10))();
    for (local_28 = *(long *)(lVar2 + 8); *(long *)(local_28 + 8) != 0;
        local_28 = *(long *)(local_28 + 8)) {
      if (*(char *)(local_28 + 0x4f) == '\x01') {
        scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x38));
      }
      else {
        scoped_array<char>::get((scoped_array<char> *)(in_RDI + 8));
      }
      bVar1 = writeNode(in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140,
                        in_stack_00000138);
      if (!bVar1) {
        return false;
      }
    }
    scoped_array<char>::get((scoped_array<char> *)(in_RDI + 0x28));
    bVar1 = writeNode(in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140,
                      in_stack_00000138);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Writer::writeUser(Lattice *lattice, StringBuffer *os) const {
  if (!writeNode(lattice, bos_format_.get(), lattice->bos_node(), os)) {
    return false;
  }
  const Node *node = 0;
  for (node = lattice->bos_node()->next; node->next; node = node->next) {
    const char *fmt = (node->stat == MECAB_UNK_NODE ? unk_format_.get() :
                       node_format_.get());
    if (!writeNode(lattice, fmt, node, os)) {
      return false;
    }
  }
  if (!writeNode(lattice, eos_format_.get(), node, os)) {
    return false;
  }
  return true;
}